

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utObjImportExport.cpp
# Opt level: O1

void __thiscall
utObjImportExport_obj_import_test_Test::~utObjImportExport_obj_import_test_Test
          (utObjImportExport_obj_import_test_Test *this)

{
  AbstractImportExportBase::~AbstractImportExportBase((AbstractImportExportBase *)this);
  operator_delete(this);
  return;
}

Assistant:

TEST_F( utObjImportExport, obj_import_test ) {
    const aiScene *scene = m_im->ReadFileFromMemory( (void*) ObjModel, strlen(ObjModel), 0 );
    aiScene *expected = createScene();
    EXPECT_NE( nullptr, scene );

    SceneDiffer differ;
    EXPECT_TRUE( differ.isEqual( expected, scene ) );
    differ.showReport();

    m_im->FreeScene();
    for(unsigned int i = 0; i < expected->mNumMeshes; ++i)
    {
        delete expected->mMeshes[i];
    }
    delete[] expected->mMeshes;
    expected->mMeshes = nullptr;
    delete[] expected->mMaterials;
    expected->mMaterials = nullptr;
    delete expected;
}